

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void gen_mir(c2m_ctx_t c2m_ctx,node_t_conflict r)

{
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  node_t_conflict pnVar2;
  type *type;
  func_type *func_type;
  gen_ctx_conflict *pgVar3;
  void *pvVar4;
  gen_ctx_conflict *pgVar5;
  HTAB_reg_var_t *pHVar6;
  VARR_HTAB_EL_reg_var_t *pVVar7;
  HTAB_EL_reg_var_t *pHVar8;
  VARR_htab_ind_t *pVVar9;
  htab_ind_t *phVar10;
  ulong uVar11;
  VARR_MIR_var_t *pVVar12;
  MIR_var_t *pMVar13;
  VARR_MIR_type_t *pVVar14;
  MIR_type_t *pMVar15;
  HTAB_MIR_item_t *pHVar16;
  VARR_HTAB_EL_MIR_item_t *pVVar17;
  HTAB_EL_MIR_item_t *pHVar18;
  code *pcVar19;
  VARR_MIR_op_t *pVVar20;
  MIR_op_t *pMVar21;
  VARR_case_t *pVVar22;
  case_t_conflict *ppcVar23;
  VARR_init_el_t *pVVar24;
  init_el_t *piVar25;
  VARR_node_t *pVVar26;
  node_t_conflict *ppnVar27;
  int iVar28;
  char *pcVar29;
  MIR_item_t_conflict *ppMVar30;
  size_t sVar31;
  node_t pnVar32;
  bool bVar33;
  MIR_item *el;
  MIR_item pi;
  MIR_proto p;
  MIR_item_t local_168;
  node_t_conflict local_160;
  undefined1 local_158 [64];
  anon_union_8_10_166bea1d_for_u local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  MIR_type_t *local_100;
  undefined1 local_f8;
  VARR_MIR_var_t *local_f0;
  char local_e8 [32];
  MIR_module_t local_c8;
  MIR_item_t pMStack_c0;
  MIR_item_t pMStack_b8;
  char *pcStack_b0;
  MIR_item_t pMStack_a8;
  void *pvStack_a0;
  MIR_module_t local_98;
  MIR_item_t pMStack_90;
  MIR_item_t pMStack_88;
  char *pcStack_80;
  MIR_item_t pMStack_78;
  void *pvStack_70;
  MIR_module_t local_68;
  MIR_item_t pMStack_60;
  MIR_item_t pMStack_58;
  char *pcStack_50;
  MIR_item_t pMStack_48;
  void *pvStack_40;
  
  ctx = c2m_ctx->ctx;
  local_160 = r;
  pgVar5 = (gen_ctx_conflict *)c2mir_calloc(c2m_ctx,0x1c0);
  c2m_ctx->gen_ctx = pgVar5;
  MIR_new_int_op(ctx,0);
  local_158._40_8_ = pMStack_48;
  local_158._48_8_ = pvStack_40;
  local_158._8_8_ = local_68;
  local_158._16_8_ = pMStack_60;
  local_158._24_8_ = pMStack_58;
  local_158._32_8_ = pcStack_50;
  (pgVar5->zero_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar5->zero_op).field_0x8 = local_158._0_8_;
  (pgVar5->zero_op).mir_op.data = local_68;
  *(MIR_item_t *)&(pgVar5->zero_op).mir_op.field_0x8 = pMStack_60;
  (pgVar5->zero_op).mir_op.u.i = (int64_t)pMStack_58;
  (pgVar5->zero_op).mir_op.u.i = (int64_t)pMStack_58;
  (pgVar5->zero_op).mir_op.u.str.s = pcStack_50;
  *(MIR_item_t *)((long)&(pgVar5->zero_op).mir_op.u + 0x10) = pMStack_48;
  (pgVar5->zero_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_40;
  MIR_new_int_op(ctx,1);
  local_158._40_8_ = pMStack_78;
  local_158._48_8_ = pvStack_70;
  local_158._8_8_ = local_98;
  local_158._16_8_ = pMStack_90;
  local_158._24_8_ = pMStack_88;
  local_158._32_8_ = pcStack_80;
  (pgVar5->one_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar5->one_op).field_0x8 = local_158._0_8_;
  (pgVar5->one_op).mir_op.data = local_98;
  *(MIR_item_t *)&(pgVar5->one_op).mir_op.field_0x8 = pMStack_90;
  (pgVar5->one_op).mir_op.u.i = (int64_t)pMStack_88;
  (pgVar5->one_op).mir_op.u.i = (int64_t)pMStack_88;
  (pgVar5->one_op).mir_op.u.str.s = pcStack_80;
  *(MIR_item_t *)((long)&(pgVar5->one_op).mir_op.u + 0x10) = pMStack_78;
  (pgVar5->one_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_70;
  MIR_new_int_op(ctx,-1);
  local_158._40_8_ = pMStack_a8;
  local_158._48_8_ = pvStack_a0;
  local_158._8_8_ = local_c8;
  local_158._16_8_ = pMStack_c0;
  local_158._24_8_ = pMStack_b8;
  local_158._32_8_ = pcStack_b0;
  (pgVar5->minus_one_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar5->minus_one_op).field_0x8 = local_158._0_8_;
  (pgVar5->minus_one_op).mir_op.data = local_c8;
  *(MIR_item_t *)&(pgVar5->minus_one_op).mir_op.field_0x8 = pMStack_c0;
  (pgVar5->minus_one_op).mir_op.u.i = (int64_t)pMStack_b8;
  (pgVar5->minus_one_op).mir_op.u.i = (int64_t)pMStack_b8;
  (pgVar5->minus_one_op).mir_op.u.str.s = pcStack_b0;
  *(MIR_item_t *)((long)&(pgVar5->minus_one_op).mir_op.u + 0x10) = pMStack_a8;
  (pgVar5->minus_one_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_a0;
  pgVar1 = c2m_ctx->gen_ctx;
  pgVar1->reg_free_mark = 0;
  pcVar29 = (char *)0x40;
  pHVar6 = (HTAB_reg_var_t *)malloc(0x40);
  if (pHVar6 == (HTAB_reg_var_t *)0x0) {
LAB_0017b093:
    mir_htab_error(pcVar29);
  }
  pcVar29 = &DAT_00000018;
  pVVar7 = (VARR_HTAB_EL_reg_var_t *)malloc(0x18);
  pHVar6->els = pVVar7;
  if (pVVar7 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_0017b089;
  pVVar7->els_num = 0;
  pVVar7->size = 0x80;
  pHVar8 = (HTAB_EL_reg_var_t *)malloc(0xc00);
  pVVar7->varr = pHVar8;
  if (pHVar8 == (HTAB_EL_reg_var_t *)0x0) {
LAB_0017b0a2:
    gen_mir_cold_22();
LAB_0017b0a7:
    gen_mir_cold_20();
LAB_0017b0ac:
    gen_mir_cold_4();
LAB_0017b0b4:
    gen_mir_cold_3();
LAB_0017b0b9:
    gen_mir_cold_2();
LAB_0017b0be:
    gen_mir_cold_1();
LAB_0017b0c3:
    gen_mir_cold_5();
LAB_0017b0cb:
    gen_mir_cold_6();
LAB_0017b0d3:
    gen_mir_cold_7();
LAB_0017b0db:
    gen_mir_cold_8();
LAB_0017b0e3:
    gen_mir_cold_9();
LAB_0017b0eb:
    gen_mir_cold_10();
  }
  else {
    pVVar7->size = 0x80;
    pVVar7->els_num = 0x80;
    pcVar29 = &DAT_00000018;
    pVVar9 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar6->entries = pVVar9;
    if (pVVar9 == (VARR_htab_ind_t *)0x0) goto LAB_0017b089;
    pVVar9->els_num = 0;
    pVVar9->size = 0x100;
    phVar10 = (htab_ind_t *)malloc(0x400);
    pVVar9->varr = phVar10;
    pHVar6->arg = (void *)0x0;
    pHVar6->hash_func = reg_var_hash;
    pHVar6->eq_func = reg_var_eq;
    pHVar6->free_func = (_func_void_reg_var_t_void_ptr *)0x0;
    pHVar6->els_num = 0;
    pHVar6->els_start = 0;
    pHVar6->els_bound = 0;
    pHVar6->collisions = 0;
    iVar28 = 0x100;
    do {
      pVVar9 = pHVar6->entries;
      if (pVVar9->varr == (htab_ind_t *)0x0) {
        gen_mir_cold_21();
        goto LAB_0017b03c;
      }
      uVar11 = pVVar9->els_num + 1;
      if (pVVar9->size < uVar11) {
        sVar31 = (uVar11 >> 1) + uVar11;
        phVar10 = (htab_ind_t *)realloc(pVVar9->varr,sVar31 * 4);
        pVVar9->varr = phVar10;
        pVVar9->size = sVar31;
      }
      sVar31 = pVVar9->els_num;
      pVVar9->els_num = sVar31 + 1;
      pVVar9->varr[sVar31] = 0xffffffff;
      iVar28 = iVar28 + -1;
    } while (iVar28 != 0);
    pgVar1->reg_var_tab = pHVar6;
    pcVar29 = &DAT_00000018;
    pVVar12 = (VARR_MIR_var_t *)malloc(0x18);
    (pgVar5->proto_info).arg_vars = pVVar12;
    if (pVVar12 == (VARR_MIR_var_t *)0x0) goto LAB_0017b089;
    pVVar12->els_num = 0;
    pVVar12->size = 0x20;
    pMVar13 = (MIR_var_t *)malloc(0x300);
    pVVar12->varr = pMVar13;
    pcVar29 = &DAT_00000018;
    pVVar14 = (VARR_MIR_type_t *)malloc(0x18);
    (pgVar5->proto_info).ret_types = pVVar14;
    if (pVVar14 == (VARR_MIR_type_t *)0x0) goto LAB_0017b089;
    pVVar14->els_num = 0;
    pVVar14->size = 0x10;
    pMVar15 = (MIR_type_t *)malloc(0x40);
    pVVar14->varr = pMVar15;
    pgVar1 = c2m_ctx->gen_ctx;
    pgVar1->curr_mir_proto_num = 0;
    pcVar29 = (char *)0x40;
    pHVar16 = (HTAB_MIR_item_t *)malloc(0x40);
    if (pHVar16 == (HTAB_MIR_item_t *)0x0) goto LAB_0017b093;
    pcVar29 = &DAT_00000018;
    pVVar17 = (VARR_HTAB_EL_MIR_item_t *)malloc(0x18);
    pHVar16->els = pVVar17;
    if (pVVar17 == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_0017b089;
    pVVar17->els_num = 0;
    pVVar17->size = 0x200;
    pHVar18 = (HTAB_EL_MIR_item_t *)malloc(0x2000);
    pVVar17->varr = pHVar18;
    if (pHVar18 == (HTAB_EL_MIR_item_t *)0x0) goto LAB_0017b0a7;
    pVVar17->size = 0x200;
    pVVar17->els_num = 0x200;
    pcVar29 = &DAT_00000018;
    pVVar9 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar16->entries = pVVar9;
    if (pVVar9 == (VARR_htab_ind_t *)0x0) goto LAB_0017b089;
    pVVar9->els_num = 0;
    pVVar9->size = 0x400;
    phVar10 = (htab_ind_t *)malloc(0x1000);
    pVVar9->varr = phVar10;
    pHVar16->arg = (void *)0x0;
    pHVar16->hash_func = proto_hash;
    pHVar16->eq_func = proto_eq;
    pHVar16->free_func = (_func_void_MIR_item_t_void_ptr *)0x0;
    pHVar16->els_num = 0;
    pHVar16->els_start = 0;
    pHVar16->els_bound = 0;
    pHVar16->collisions = 0;
    iVar28 = 0x400;
    do {
      pVVar9 = pHVar16->entries;
      if (pVVar9->varr == (htab_ind_t *)0x0) goto LAB_0017b03c;
      uVar11 = pVVar9->els_num + 1;
      if (pVVar9->size < uVar11) {
        sVar31 = (uVar11 >> 1) + uVar11;
        phVar10 = (htab_ind_t *)realloc(pVVar9->varr,sVar31 * 4);
        pVVar9->varr = phVar10;
        pVVar9->size = sVar31;
      }
      sVar31 = pVVar9->els_num;
      pVVar9->els_num = sVar31 + 1;
      pVVar9->varr[sVar31] = 0xffffffff;
      iVar28 = iVar28 + -1;
    } while (iVar28 != 0);
    pgVar1->proto_tab = pHVar16;
    pVVar26 = c2m_ctx->call_nodes;
    if (pVVar26 != (VARR_node_t *)0x0) {
      uVar11 = 0;
      do {
        if (pVVar26->els_num <= uVar11) goto LAB_0017aad9;
        if (pVVar26->varr == (node_t_conflict *)0x0) goto LAB_0017b046;
        pnVar2 = pVVar26->varr[uVar11];
        if (pnVar2->code != N_CALL) {
          __assert_fail("call->code == N_CALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x34cb,"void gen_mir_protos(c2m_ctx_t)");
        }
        pnVar32 = (pnVar2->u).ops.head;
        if ((pnVar32->code == N_ID) &&
           (iVar28 = strcmp((pnVar32->u).s.s,"__builtin_jcall"), iVar28 == 0)) {
          pnVar32 = (node_t)(((pnVar32->op_link).next)->u).l;
        }
        type = *(type **)((long)pnVar32->attr + 0x18);
        if ((type->mode != TM_PTR) || (((type->u).ptr_type)->mode != TM_FUNC)) {
          __assert_fail("type->mode == TM_PTR && type->u.ptr_type->mode == TM_FUNC",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x34d2,"void gen_mir_protos(c2m_ctx_t)");
        }
        set_type_layout(c2m_ctx,type);
        func_type = *(func_type **)((type->u).tag_type + 1);
        if (func_type->param_list->code != N_LIST) goto LAB_0017b04b;
        collect_args_and_func_types(c2m_ctx,func_type);
        bVar33 = true;
        if ((undefined1  [32])((undefined1  [32])*func_type & (undefined1  [32])0x1) ==
            (undefined1  [32])0x0) {
          bVar33 = (func_type->param_list->u).s.s == (char *)0x0;
        }
        pgVar3 = c2m_ctx->gen_ctx;
        local_118.func = (MIR_func_t)local_110;
        pVVar14 = (pgVar3->proto_info).ret_types;
        local_f8 = bVar33;
        if (pVVar14 == (VARR_MIR_type_t *)0x0) goto LAB_0017b041;
        local_108 = (undefined4)pVVar14->els_num;
        local_100 = pVVar14->varr;
        local_f0 = (pgVar3->proto_info).arg_vars;
        iVar28 = HTAB_MIR_item_t_do(pgVar3->proto_tab,(MIR_item_t)local_158,HTAB_FIND,&local_168);
        if (iVar28 == 0) {
          pgVar3->curr_mir_proto_num = pgVar3->curr_mir_proto_num + 1;
          pcVar29 = local_e8;
          sprintf(pcVar29,"proto%d");
          if ((pgVar3->proto_info).arg_vars == (VARR_MIR_var_t *)0x0) {
            gen_mir_cold_15();
            goto LAB_0017b093;
          }
          pcVar19 = MIR_new_vararg_proto_arr;
          if (!bVar33) {
            pcVar19 = MIR_new_proto_arr;
          }
          local_168 = (MIR_item_t)(*pcVar19)(c2m_ctx->ctx,local_e8,local_108,local_100);
          HTAB_MIR_item_t_do(pgVar3->proto_tab,local_168,HTAB_INSERT,&local_168);
        }
        func_type->proto_item = local_168;
        uVar11 = uVar11 + 1;
        pVVar26 = c2m_ctx->call_nodes;
      } while (pVVar26 != (VARR_node_t *)0x0);
    }
    gen_mir_cold_18();
LAB_0017aad9:
    pHVar16 = pgVar1->proto_tab;
    if (pHVar16->free_func != (_func_void_MIR_item_t_void_ptr *)0x0) {
      if (pHVar16->els == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_0017b0b9;
      if (pHVar16->els_bound != 0) {
        pvVar4 = pHVar16->arg;
        ppMVar30 = &pHVar16->els->varr->el;
        uVar11 = 0;
        do {
          if (((HTAB_EL_MIR_item_t *)(ppMVar30 + -1))->hash != 0) {
            (*pHVar16->free_func)(*ppMVar30,pvVar4);
          }
          uVar11 = uVar11 + 1;
          ppMVar30 = ppMVar30 + 2;
        } while (uVar11 < pHVar16->els_bound);
      }
      pHVar16->els_bound = 0;
      pHVar16->els_num = 0;
      pHVar16->els_start = 0;
      pVVar9 = pHVar16->entries;
      if (pVVar9 != (VARR_htab_ind_t *)0x0) {
        if ((int)pVVar9->els_num != 0) {
          memset(pVVar9->varr,0xff,(pVVar9->els_num & 0xffffffff) << 2);
        }
        goto LAB_0017ab6e;
      }
      goto LAB_0017b0be;
    }
LAB_0017ab6e:
    pHVar16 = pgVar1->proto_tab;
    pVVar17 = pHVar16->els;
    if ((pVVar17 == (VARR_HTAB_EL_MIR_item_t *)0x0) || (pVVar17->varr == (HTAB_EL_MIR_item_t *)0x0))
    {
      gen_mir_cold_14();
LAB_0017b09d:
      gen_mir_cold_13();
      goto LAB_0017b0a2;
    }
    free(pVVar17->varr);
    free(pVVar17);
    pHVar16->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
    pHVar16 = pgVar1->proto_tab;
    pVVar9 = pHVar16->entries;
    if ((pVVar9 == (VARR_htab_ind_t *)0x0) || (pVVar9->varr == (htab_ind_t *)0x0))
    goto LAB_0017b09d;
    free(pVVar9->varr);
    free(pVVar9);
    pHVar16->entries = (VARR_htab_ind_t *)0x0;
    free(pgVar1->proto_tab);
    pgVar1->proto_tab = (HTAB_MIR_item_t *)0x0;
    pcVar29 = &DAT_00000018;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar5->call_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) {
LAB_0017b089:
      mir_varr_error(pcVar29);
    }
    pVVar20->els_num = 0;
    pVVar20->size = 0x20;
    pMVar21 = (MIR_op_t *)malloc(0x600);
    pVVar20->varr = pMVar21;
    pcVar29 = &DAT_00000018;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar5->ret_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) goto LAB_0017b089;
    pVVar20->els_num = 0;
    pVVar20->size = 8;
    pMVar21 = (MIR_op_t *)malloc(0x180);
    pVVar20->varr = pMVar21;
    pcVar29 = &DAT_00000018;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar5->switch_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) goto LAB_0017b089;
    pVVar20->els_num = 0;
    pVVar20->size = 0x80;
    pMVar21 = (MIR_op_t *)malloc(0x1800);
    pVVar20->varr = pMVar21;
    pcVar29 = &DAT_00000018;
    pVVar22 = (VARR_case_t *)malloc(0x18);
    pgVar5->switch_cases = pVVar22;
    if (pVVar22 == (VARR_case_t *)0x0) goto LAB_0017b089;
    pVVar22->els_num = 0;
    pVVar22->size = 0x40;
    ppcVar23 = (case_t_conflict *)malloc(0x200);
    pVVar22->varr = ppcVar23;
    pcVar29 = &DAT_00000018;
    pVVar24 = (VARR_init_el_t *)malloc(0x18);
    pgVar5->init_els = pVVar24;
    if (pVVar24 == (VARR_init_el_t *)0x0) goto LAB_0017b089;
    pVVar24->els_num = 0;
    pVVar24->size = 0x80;
    piVar25 = (init_el_t *)malloc(0x1c00);
    pVVar24->varr = piVar25;
    pcVar29 = &DAT_00000018;
    pVVar26 = (VARR_node_t *)malloc(0x18);
    pgVar5->node_stack = pVVar26;
    if (pVVar26 == (VARR_node_t *)0x0) goto LAB_0017b089;
    pVVar26->els_num = 0;
    pVVar26->size = 8;
    ppnVar27 = (node_t_conflict *)malloc(0x40);
    pVVar26->varr = ppnVar27;
    pgVar5->memset_proto = (MIR_item_t)0x0;
    pgVar5->memset_item = (MIR_item_t)0x0;
    pgVar5->memcpy_proto = (MIR_item_t)0x0;
    pgVar5->memcpy_item = (MIR_item_t)0x0;
    pgVar1 = c2m_ctx->gen_ctx;
    gen((op_t *)local_158,c2m_ctx,local_160,(MIR_label_t)0x0,(MIR_label_t)0x0,0,(op_t *)0x0,
        (int *)0x0);
    (pgVar1->top_gen_last_op).decl = (decl_t)local_158._0_8_;
    *(undefined8 *)&(pgVar1->top_gen_last_op).field_0x8 = local_158._8_8_;
    (pgVar1->top_gen_last_op).mir_op.data = (void *)local_158._16_8_;
    *(undefined8 *)&(pgVar1->top_gen_last_op).mir_op.field_0x8 = local_158._24_8_;
    (pgVar1->top_gen_last_op).mir_op.u.i = local_158._32_8_;
    (pgVar1->top_gen_last_op).mir_op.u.str.s = (char *)local_158._40_8_;
    *(undefined8 *)((long)&(pgVar1->top_gen_last_op).mir_op.u + 0x10) = local_158._48_8_;
    (pgVar1->top_gen_last_op).mir_op.u.mem.disp = local_158._56_8_;
    pgVar1 = c2m_ctx->gen_ctx;
    if (pgVar1 == (gen_ctx_conflict *)0x0) {
      return;
    }
    pHVar6 = pgVar1->reg_var_tab;
    if (pHVar6 != (HTAB_reg_var_t *)0x0) {
      if (pHVar6->free_func != (_func_void_reg_var_t_void_ptr *)0x0) {
        HTAB_reg_var_t_clear(pHVar6);
      }
      pHVar6 = pgVar1->reg_var_tab;
      pVVar7 = pHVar6->els;
      if ((pVVar7 == (VARR_HTAB_EL_reg_var_t *)0x0) || (pVVar7->varr == (HTAB_EL_reg_var_t *)0x0))
      goto LAB_0017b0ac;
      free(pVVar7->varr);
      free(pVVar7);
      pHVar6->els = (VARR_HTAB_EL_reg_var_t *)0x0;
      pHVar6 = pgVar1->reg_var_tab;
      pVVar9 = pHVar6->entries;
      if ((pVVar9 != (VARR_htab_ind_t *)0x0) && (pVVar9->varr != (htab_ind_t *)0x0)) {
        free(pVVar9->varr);
        free(pVVar9);
        pHVar6->entries = (VARR_htab_ind_t *)0x0;
        free(pgVar1->reg_var_tab);
        pgVar1->reg_var_tab = (HTAB_reg_var_t *)0x0;
        goto LAB_0017ae54;
      }
      goto LAB_0017b0b4;
    }
LAB_0017ae54:
    pVVar12 = (pgVar1->proto_info).arg_vars;
    if (pVVar12 != (VARR_MIR_var_t *)0x0) {
      if (pVVar12->varr != (MIR_var_t *)0x0) {
        free(pVVar12->varr);
        free(pVVar12);
        (pgVar1->proto_info).arg_vars = (VARR_MIR_var_t *)0x0;
        goto LAB_0017ae88;
      }
      goto LAB_0017b0c3;
    }
LAB_0017ae88:
    pVVar14 = (pgVar1->proto_info).ret_types;
    if (pVVar14 != (VARR_MIR_type_t *)0x0) {
      if (pVVar14->varr != (MIR_type_t *)0x0) {
        free(pVVar14->varr);
        free(pVVar14);
        (pgVar1->proto_info).ret_types = (VARR_MIR_type_t *)0x0;
        goto LAB_0017aebc;
      }
      goto LAB_0017b0cb;
    }
LAB_0017aebc:
    pVVar20 = pgVar1->call_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->call_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_0017aef0;
      }
      goto LAB_0017b0d3;
    }
LAB_0017aef0:
    pVVar20 = pgVar1->ret_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->ret_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_0017af24;
      }
      goto LAB_0017b0db;
    }
LAB_0017af24:
    pVVar20 = pgVar1->switch_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->switch_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_0017af58;
      }
      goto LAB_0017b0e3;
    }
LAB_0017af58:
    pVVar22 = pgVar1->switch_cases;
    if (pVVar22 != (VARR_case_t *)0x0) {
      if (pVVar22->varr != (case_t_conflict *)0x0) {
        free(pVVar22->varr);
        free(pVVar22);
        pgVar1->switch_cases = (VARR_case_t *)0x0;
        goto LAB_0017af8c;
      }
      goto LAB_0017b0eb;
    }
LAB_0017af8c:
    pVVar24 = pgVar1->init_els;
    if (pVVar24 == (VARR_init_el_t *)0x0) {
LAB_0017afc0:
      pVVar26 = pgVar1->node_stack;
      if (pVVar26 == (VARR_node_t *)0x0) {
LAB_0017aff4:
        free(c2m_ctx->gen_ctx);
        return;
      }
      if (pVVar26->varr != (node_t_conflict *)0x0) {
        free(pVVar26->varr);
        free(pVVar26);
        pgVar1->node_stack = (VARR_node_t *)0x0;
        goto LAB_0017aff4;
      }
      goto LAB_0017b0fb;
    }
    if (pVVar24->varr != (init_el_t *)0x0) {
      free(pVVar24->varr);
      free(pVVar24);
      pgVar1->init_els = (VARR_init_el_t *)0x0;
      goto LAB_0017afc0;
    }
  }
  gen_mir_cold_11();
LAB_0017b0fb:
  gen_mir_cold_12();
  fprintf(_stderr,"%s\n","varr: no memory");
  exit(1);
LAB_0017b03c:
  gen_mir_cold_19();
LAB_0017b041:
  gen_mir_cold_16();
LAB_0017b046:
  gen_mir_cold_17();
LAB_0017b04b:
  __assert_fail("func_type->param_list->code == N_LIST",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x34d5,"void gen_mir_protos(c2m_ctx_t)");
}

Assistant:

static void gen_mir (c2m_ctx_t c2m_ctx, node_t r) {
  gen_ctx_t gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;

  c2m_ctx->gen_ctx = gen_ctx = c2mir_calloc (c2m_ctx, sizeof (struct gen_ctx));
  zero_op = new_op (NULL, MIR_new_int_op (ctx, 0));
  one_op = new_op (NULL, MIR_new_int_op (ctx, 1));
  minus_one_op = new_op (NULL, MIR_new_int_op (ctx, -1));
  init_reg_vars (c2m_ctx);
  VARR_CREATE (MIR_var_t, proto_info.arg_vars, 32);
  VARR_CREATE (MIR_type_t, proto_info.ret_types, 16);
  gen_mir_protos (c2m_ctx);
  VARR_CREATE (MIR_op_t, call_ops, 32);
  VARR_CREATE (MIR_op_t, ret_ops, 8);
  VARR_CREATE (MIR_op_t, switch_ops, 128);
  VARR_CREATE (case_t, switch_cases, 64);
  VARR_CREATE (init_el_t, init_els, 128);
  VARR_CREATE (node_t, node_stack, 8);
  memset_proto = memset_item = memcpy_proto = memcpy_item = NULL;
  top_gen (c2m_ctx, r, NULL, NULL, NULL);
  gen_finish (c2m_ctx);
}